

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

AABox * __thiscall Triangle::boundingVolume(AABox *__return_storage_ptr__,Triangle *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3f *pvVar4;
  uint uVar5;
  float fVar6;
  
  fVar1 = (this->v3).x;
  fVar2 = (this->v1).x;
  fVar3 = (this->v2).x;
  fVar6 = fVar1;
  if (fVar3 <= fVar1) {
    fVar6 = fVar3;
  }
  pvVar4 = &this->v2;
  if (fVar3 < fVar1) {
    pvVar4 = &this->v3;
  }
  if (fVar2 <= fVar6) {
    fVar6 = fVar2;
  }
  __return_storage_ptr__->x1 = fVar6;
  uVar5 = -(uint)(fVar2 < pvVar4->x);
  __return_storage_ptr__->x2 = (float)(~uVar5 & (uint)(this->v1).x | (uint)pvVar4->x & uVar5);
  fVar1 = (this->v3).y;
  fVar2 = (this->v1).y;
  fVar3 = (this->v2).y;
  fVar6 = fVar1;
  if (fVar3 <= fVar1) {
    fVar6 = fVar3;
  }
  if (fVar2 <= fVar6) {
    fVar6 = fVar2;
  }
  __return_storage_ptr__->y1 = fVar6;
  pvVar4 = &this->v2;
  if (fVar3 < fVar1) {
    pvVar4 = &this->v3;
  }
  uVar5 = -(uint)(fVar2 < pvVar4->y);
  __return_storage_ptr__->y2 = (float)(~uVar5 & (uint)(this->v1).y | (uint)pvVar4->y & uVar5);
  fVar1 = (this->v3).z;
  fVar2 = (this->v2).z;
  fVar3 = (this->v1).z;
  fVar6 = fVar1;
  if (fVar2 <= fVar1) {
    fVar6 = fVar2;
  }
  if (fVar3 <= fVar6) {
    fVar6 = fVar3;
  }
  __return_storage_ptr__->z1 = fVar6;
  pvVar4 = &this->v2;
  if (fVar2 < fVar1) {
    pvVar4 = &this->v3;
  }
  uVar5 = -(uint)(fVar3 < pvVar4->z);
  __return_storage_ptr__->z2 = (float)(~uVar5 & (uint)(this->v1).z | (uint)pvVar4->z & uVar5);
  return __return_storage_ptr__;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = std::min(v1.x, std::min(v2.x, v3.x));
		v.x2 = std::max(v1.x, std::max(v2.x, v3.x));
		v.y1 = std::min(v1.y, std::min(v2.y, v3.y));
		v.y2 = std::max(v1.y, std::max(v2.y, v3.y));
		v.z1 = std::min(v1.z, std::min(v2.z, v3.z));
		v.z2 = std::max(v1.z, std::max(v2.z, v3.z));
		return v;
	}